

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O0

void * qemu_ram_ptr_length(uc_struct_conflict15 *uc,RAMBlock *ram_block,ram_addr_t addr,hwaddr *size
                          ,_Bool lock)

{
  hwaddr local_48;
  RAMBlock *local_40;
  RAMBlock *block;
  _Bool lock_local;
  hwaddr *size_local;
  ram_addr_t addr_local;
  RAMBlock *ram_block_local;
  uc_struct_conflict15 *uc_local;
  
  if (*size == 0) {
    uc_local = (uc_struct_conflict15 *)0x0;
  }
  else {
    local_40 = ram_block;
    size_local = (hwaddr *)addr;
    if (ram_block == (RAMBlock *)0x0) {
      local_40 = qemu_get_ram_block(uc,addr);
      size_local = (hwaddr *)(addr - local_40->offset);
    }
    if (*size < local_40->max_length - (long)size_local) {
      local_48 = *size;
    }
    else {
      local_48 = local_40->max_length - (long)size_local;
    }
    *size = local_48;
    uc_local = (uc_struct_conflict15 *)ramblock_ptr(local_40,(ram_addr_t)size_local);
  }
  return uc_local;
}

Assistant:

static void *qemu_ram_ptr_length(struct uc_struct *uc, RAMBlock *ram_block, ram_addr_t addr,
                                 hwaddr *size, bool lock)
{
    RAMBlock *block = ram_block;
    if (*size == 0) {
        return NULL;
    }

    if (block == NULL) {
        block = qemu_get_ram_block(uc, addr);
        addr -= block->offset;
    }
    *size = MIN(*size, block->max_length - addr);

    return ramblock_ptr(block, addr);
}